

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::Equip(Character *this,short item,uchar subloc)

{
  uint uVar1;
  World *pWVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  EIF_Data *pEVar6;
  ECF_Data *pEVar7;
  EIF_Data *pEVar8;
  EquipLocation slot1;
  string *this_00;
  EquipLocation EStack_a0;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  iVar4 = HasItem(this,item,false);
  if (iVar4 == 0) {
    return false;
  }
  pEVar6 = EIF::Get(this->world->eif,(int)item);
  pEVar7 = ECF::Get(this->world->ecf,(uint)this->clas);
  TVar5 = pEVar6->type;
  if ((TVar5 == Armor) && ((pEVar6->field_26).gender != this->gender)) {
    return false;
  }
  if ((TVar5 == Weapon) && (pEVar6->subtype == TwoHanded)) {
    uVar1 = (this->paperdoll)._M_elems[7];
    if (uVar1 != 0) {
      pEVar8 = EIF::Get(this->world->eif,uVar1);
      if (((pEVar6->field_27).scrolly != '\0') || ((pEVar8->subtype & ~Ranged) != Arrows)) {
        pWVar2 = this->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"two_handed_fail_1",&local_89);
        I18N::Format<>(&local_48,&pWVar2->i18n,&local_88);
        (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_48);
        this_00 = &local_48;
        goto LAB_001114fe;
      }
      TVar5 = pEVar6->type;
      goto LAB_00111357;
    }
  }
  else {
LAB_00111357:
    if ((((TVar5 == Shield) && (uVar1 = (this->paperdoll)._M_elems[8], uVar1 != 0)) &&
        (pEVar8 = EIF::Get(this->world->eif,uVar1), pEVar8->subtype == TwoHanded)) &&
       (((pEVar8->field_27).scrolly != '\0' || ((pEVar6->subtype & ~Ranged) != Arrows)))) {
      pWVar2 = this->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"two_handed_fail_2",&local_89);
      I18N::Format<>(&local_68,&pWVar2->i18n,&local_88);
      (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_68);
      this_00 = &local_68;
LAB_001114fe:
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)&local_88);
      return false;
    }
  }
  if ((((short)(ushort)this->level < pEVar6->levelreq) ||
      (((ushort)this->clas != pEVar6->classreq && ((ushort)pEVar7->base != pEVar6->classreq)))) ||
     ((*this->display_str < (int)pEVar6->strreq ||
      ((((*this->display_intl < (int)pEVar6->intreq || (*this->display_wis < (int)pEVar6->wisreq))
        || (*this->display_agi < (int)pEVar6->agireq)) ||
       ((*this->display_con < (int)pEVar6->conreq || (*this->display_cha < (int)pEVar6->chareq))))))
     )) {
switchD_00111461_default:
    return false;
  }
  switch(pEVar6->type) {
  case Weapon:
    EStack_a0._0_1_ = '\b';
    break;
  case Shield:
    EStack_a0._0_1_ = '\a';
    break;
  case Armor:
    EStack_a0._0_1_ = '\x04';
    break;
  case Hat:
    EStack_a0._0_1_ = '\x06';
    break;
  case Boots:
    EStack_a0._0_1_ = '\0';
    break;
  case Gloves:
    EStack_a0._0_1_ = '\x02';
    break;
  case Accessory:
    EStack_a0._0_1_ = '\x01';
    break;
  case Belt:
    EStack_a0._0_1_ = '\x03';
    break;
  case Necklace:
    EStack_a0._0_1_ = '\x05';
    break;
  case Ring:
    slot1 = Ring1;
    EStack_a0 = Ring2;
    goto LAB_0011155c;
  case Armlet:
    slot1 = Armlet1;
    EStack_a0 = Armlet2;
    goto LAB_0011155c;
  case Bracer:
    slot1 = Bracer1;
    EStack_a0 = Bracer2;
LAB_0011155c:
    bVar3 = character_equip_twoslot(this,item,subloc,slot1,EStack_a0);
    return bVar3;
  default:
    goto switchD_00111461_default;
  }
  bVar3 = character_equip_oneslot(this,item,(undefined1)EStack_a0,0x181040);
  return bVar3;
}

Assistant:

bool Character::Equip(short item, unsigned char subloc)
{
	if (!this->HasItem(item))
	{
		return false;
	}

	const EIF_Data &eif = this->world->eif->Get(item);
	const ECF_Data &ecf = this->world->ecf->Get(this->clas);

	if (eif.type == EIF::Armor && eif.gender != this->gender)
	{
		return false;
	}

	if (eif.type == EIF::Weapon && eif.subtype == EIF::TwoHanded)
	{
		if (this->paperdoll[Shield])
		{
			const EIF_Data& shield_eif = this->world->eif->Get(this->paperdoll[Shield]);

			if (eif.dual_wield_dollgraphic || (shield_eif.subtype != EIF::Arrows && shield_eif.subtype != EIF::Wings))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_1"));
				return false;
			}
		}
	}

	if (eif.type == EIF::Shield)
	{
		if (this->paperdoll[Weapon])
		{
			const EIF_Data& weapon_eif = this->world->eif->Get(this->paperdoll[Weapon]);

			if (weapon_eif.subtype == EIF::TwoHanded
			 && (weapon_eif.dual_wield_dollgraphic || (eif.subtype != EIF::Arrows && eif.subtype != EIF::Wings)))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_2"));
				return false;
			}
		}
	}

	if (this->level < eif.levelreq || (this->clas != eif.classreq && ecf.base != eif.classreq)
	 || this->display_str < eif.strreq || this->display_intl < eif.intreq
	 || this->display_wis < eif.wisreq || this->display_agi < eif.agireq
	 || this->display_con < eif.conreq || this->display_cha < eif.chareq)
	{
		return false;
	}

	switch (eif.type)
	{
		case EIF::Weapon: return character_equip_oneslot(this, item, subloc, Weapon);
		case EIF::Shield: return character_equip_oneslot(this, item, subloc, Shield);
		case EIF::Hat: return character_equip_oneslot(this, item, subloc, Hat);
		case EIF::Boots: return character_equip_oneslot(this, item, subloc, Boots);
		case EIF::Gloves: return character_equip_oneslot(this, item, subloc, Gloves);
		case EIF::Accessory: return character_equip_oneslot(this, item, subloc, Accessory);
		case EIF::Belt: return character_equip_oneslot(this, item, subloc, Belt);
		case EIF::Armor: return character_equip_oneslot(this, item, subloc, Armor);
		case EIF::Necklace: return character_equip_oneslot(this, item, subloc, Necklace);
		case EIF::Ring: return character_equip_twoslot(this, item, subloc, Ring1, Ring2);
		case EIF::Armlet: return character_equip_twoslot(this, item, subloc, Armlet1, Armlet2);
		case EIF::Bracer: return character_equip_twoslot(this, item, subloc, Bracer1, Bracer2);
		default: return false;
	}
}